

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NavMoveRequestApplyResult(void)

{
  float *pfVar1;
  float fVar2;
  ImVec2 IVar3;
  ImGuiID IVar4;
  ImGuiWindow_conflict *pIVar5;
  float fVar6;
  ImGuiContext_conflict1 *pIVar7;
  uint uVar8;
  ImGuiID focus_scope_id;
  ImGuiNavItemData_conflict *pIVar9;
  ImVec2 IVar10;
  float fVar11;
  ImRect rect_abs;
  ImRect local_20;
  
  pIVar7 = GImGui;
  if ((GImGui->NavMoveResultLocal).ID == 0) {
    if ((GImGui->NavMoveResultOther).ID == 0) {
      uVar8 = GImGui->NavMoveFlags;
      if ((uVar8 >> 9 & 1) != 0) {
        uVar8 = uVar8 | 0x800;
        GImGui->NavMoveFlags = uVar8;
      }
      if (pIVar7->NavId == 0) {
        return;
      }
      if ((uVar8 & 0x800) != 0) {
        return;
      }
      pIVar7->NavDisableHighlight = false;
      goto LAB_001883ed;
    }
    pIVar9 = &GImGui->NavMoveResultOther;
  }
  else {
    pIVar9 = &GImGui->NavMoveResultLocal;
  }
  if ((((GImGui->NavMoveFlags & 0x20U) != 0) &&
      (IVar4 = (GImGui->NavMoveResultLocalVisible).ID, IVar4 != 0)) && (IVar4 != GImGui->NavId)) {
    pIVar9 = &GImGui->NavMoveResultLocalVisible;
  }
  if (pIVar9 == &GImGui->NavMoveResultOther) {
LAB_00188298:
    pIVar9 = &GImGui->NavMoveResultOther;
  }
  else if (((GImGui->NavMoveResultOther).ID != 0) &&
          (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
    fVar11 = (GImGui->NavMoveResultOther).DistBox;
    fVar2 = pIVar9->DistBox;
    if (fVar2 <= fVar11) {
      if (((fVar11 != fVar2) || (NAN(fVar11) || NAN(fVar2))) ||
         (pfVar1 = &(GImGui->NavMoveResultOther).DistCenter,
         pIVar9->DistCenter < *pfVar1 || pIVar9->DistCenter == *pfVar1)) goto LAB_0018829b;
    }
    goto LAB_00188298;
  }
LAB_0018829b:
  if ((GImGui->NavWindow == (ImGuiWindow_conflict *)0x0) ||
     (pIVar5 = pIVar9->Window, pIVar5 == (ImGuiWindow_conflict *)0x0)) {
    __assert_fail("g.NavWindow && result->Window",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x2804,"void ImGui::NavMoveRequestApplyResult()");
  }
  if (GImGui->NavLayer == ImGuiNavLayer_Main) {
    if ((GImGui->NavMoveFlags & 0x40U) == 0) {
      IVar10 = (pIVar9->RectRel).Min;
      IVar3 = (pIVar9->RectRel).Max;
      local_20.Max.x = (pIVar5->Pos).x;
      local_20.Min.x = IVar10.x + local_20.Max.x;
      local_20.Max.y = (pIVar5->Pos).y;
      local_20.Min.y = IVar10.y + local_20.Max.y;
      local_20.Max.x = IVar3.x + local_20.Max.x;
      local_20.Max.y = IVar3.y + local_20.Max.y;
      IVar10 = ScrollToRectEx(pIVar9->Window,&local_20,GImGui->NavMoveScrollFlags);
    }
    else {
      fVar11 = 0.0;
      if (GImGui->NavMoveDir == 2) {
        fVar11 = (pIVar5->ScrollMax).y;
      }
      (pIVar5->ScrollTarget).y = fVar11;
      (pIVar5->ScrollTargetCenterRatio).y = 0.0;
      IVar10 = (ImVec2)((ulong)(uint)((pIVar5->Scroll).y - fVar11) << 0x20);
      (pIVar5->ScrollTargetEdgeSnapDist).y = 0.0;
    }
    fVar11 = (pIVar9->RectRel).Min.y;
    fVar2 = (pIVar9->RectRel).Max.x;
    fVar6 = (pIVar9->RectRel).Max.y;
    (pIVar9->RectRel).Min.x = (pIVar9->RectRel).Min.x - IVar10.x;
    (pIVar9->RectRel).Min.y = fVar11 - IVar10.y;
    (pIVar9->RectRel).Max.x = fVar2 - IVar10.x;
    (pIVar9->RectRel).Max.y = fVar6 - IVar10.y;
  }
  ClearActiveID();
  pIVar7->NavWindow = pIVar9->Window;
  IVar4 = pIVar9->ID;
  if (pIVar7->NavId == IVar4) {
    focus_scope_id = pIVar9->FocusScopeId;
  }
  else {
    pIVar7->NavJustMovedToId = IVar4;
    focus_scope_id = pIVar9->FocusScopeId;
    pIVar7->NavJustMovedToFocusScopeId = focus_scope_id;
    pIVar7->NavJustMovedToKeyMods = pIVar7->NavMoveKeyMods;
  }
  SetNavID(IVar4,pIVar7->NavLayer,focus_scope_id,&pIVar9->RectRel);
  uVar8 = pIVar7->NavMoveFlags;
  if (((uVar8 >> 9 & 1) != 0) && ((pIVar9->InFlags & 0x100) != 0)) {
    pIVar7->NavNextActivateId = pIVar9->ID;
    pIVar7->NavNextActivateFlags = 5;
    uVar8 = uVar8 | 0x800;
    pIVar7->NavMoveFlags = uVar8;
  }
  if ((uVar8 >> 10 & 1) != 0) {
    pIVar7->NavNextActivateId = pIVar9->ID;
    pIVar7->NavNextActivateFlags = 0;
  }
  if ((uVar8 >> 0xb & 1) != 0) {
    return;
  }
  pIVar7->NavMousePosDirty = true;
  pIVar7->NavDisableHighlight = false;
LAB_001883ed:
  pIVar7->NavDisableMouseHover = true;
  return;
}

Assistant:

void ImGui::NavMoveRequestApplyResult()
{
    ImGuiContext& g = *GImGui;
#if IMGUI_DEBUG_NAV_SCORING
    if (g.NavMoveFlags & ImGuiNavMoveFlags_DebugNoResult) // [DEBUG] Scoring all items in NavWindow at all times
        return;
#endif

    // Select which result to use
    ImGuiNavItemData* result = (g.NavMoveResultLocal.ID != 0) ? &g.NavMoveResultLocal : (g.NavMoveResultOther.ID != 0) ? &g.NavMoveResultOther : NULL;

    // In a situation when there is no results but NavId != 0, re-enable the Navigation highlight (because g.NavId is not considered as a possible result)
    if (result == NULL)
    {
        if (g.NavMoveFlags & ImGuiNavMoveFlags_Tabbing)
            g.NavMoveFlags |= ImGuiNavMoveFlags_DontSetNavHighlight;
        if (g.NavId != 0 && (g.NavMoveFlags & ImGuiNavMoveFlags_DontSetNavHighlight) == 0)
        {
            g.NavDisableHighlight = false;
            g.NavDisableMouseHover = true;
        }
        return;
    }

    // PageUp/PageDown behavior first jumps to the bottom/top mostly visible item, _otherwise_ use the result from the previous/next page.
    if (g.NavMoveFlags & ImGuiNavMoveFlags_AlsoScoreVisibleSet)
        if (g.NavMoveResultLocalVisible.ID != 0 && g.NavMoveResultLocalVisible.ID != g.NavId)
            result = &g.NavMoveResultLocalVisible;

    // Maybe entering a flattened child from the outside? In this case solve the tie using the regular scoring rules.
    if (result != &g.NavMoveResultOther && g.NavMoveResultOther.ID != 0 && g.NavMoveResultOther.Window->ParentWindow == g.NavWindow)
        if ((g.NavMoveResultOther.DistBox < result->DistBox) || (g.NavMoveResultOther.DistBox == result->DistBox && g.NavMoveResultOther.DistCenter < result->DistCenter))
            result = &g.NavMoveResultOther;
    IM_ASSERT(g.NavWindow && result->Window);

    // Scroll to keep newly navigated item fully into view.
    if (g.NavLayer == ImGuiNavLayer_Main)
    {
        ImVec2 delta_scroll;
        if (g.NavMoveFlags & ImGuiNavMoveFlags_ScrollToEdgeY)
        {
            // FIXME: Should remove this
            float scroll_target = (g.NavMoveDir == ImGuiDir_Up) ? result->Window->ScrollMax.y : 0.0f;
            delta_scroll.y = result->Window->Scroll.y - scroll_target;
            SetScrollY(result->Window, scroll_target);
        }
        else
        {
            ImRect rect_abs = ImRect(result->RectRel.Min + result->Window->Pos, result->RectRel.Max + result->Window->Pos);
            delta_scroll = ScrollToRectEx(result->Window, rect_abs, g.NavMoveScrollFlags);
        }

        // Offset our result position so mouse position can be applied immediately after in NavUpdate()
        result->RectRel.TranslateX(-delta_scroll.x);
        result->RectRel.TranslateY(-delta_scroll.y);
    }

    ClearActiveID();
    g.NavWindow = result->Window;
    if (g.NavId != result->ID)
    {
        // Don't set NavJustMovedToId if just landed on the same spot (which may happen with ImGuiNavMoveFlags_AllowCurrentNavId)
        g.NavJustMovedToId = result->ID;
        g.NavJustMovedToFocusScopeId = result->FocusScopeId;
        g.NavJustMovedToKeyMods = g.NavMoveKeyMods;
    }

    // Focus
    IMGUI_DEBUG_LOG_NAV("[nav] NavMoveRequest: result NavID 0x%08X in Layer %d Window \"%s\"\n", result->ID, g.NavLayer, g.NavWindow->Name);
    SetNavID(result->ID, g.NavLayer, result->FocusScopeId, result->RectRel);

    // Tabbing: Activates Inputable or Focus non-Inputable
    if ((g.NavMoveFlags & ImGuiNavMoveFlags_Tabbing) && (result->InFlags & ImGuiItemFlags_Inputable))
    {
        g.NavNextActivateId = result->ID;
        g.NavNextActivateFlags = ImGuiActivateFlags_PreferInput | ImGuiActivateFlags_TryToPreserveState;
        g.NavMoveFlags |= ImGuiNavMoveFlags_DontSetNavHighlight;
    }

    // Activate
    if (g.NavMoveFlags & ImGuiNavMoveFlags_Activate)
    {
        g.NavNextActivateId = result->ID;
        g.NavNextActivateFlags = ImGuiActivateFlags_None;
    }

    // Enable nav highlight
    if ((g.NavMoveFlags & ImGuiNavMoveFlags_DontSetNavHighlight) == 0)
    {
        g.NavDisableHighlight = false;
        g.NavDisableMouseHover = g.NavMousePosDirty = true;
    }
}